

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O3

shared_ptr<const_pstore::index::details::internal_node> __thiscall
pstore::index::details::internal_node::read_node
          (internal_node *this,database *db,
          typed_address<pstore::index::details::internal_node> addr)

{
  _Alloc_hider this_00;
  size_type this_01;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_pstore::index::details::internal_node> sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (*db->_vptr_database[2])(&local_48,db,addr.a_.a_,0x10,1,0);
  this_01 = local_48._M_string_length;
  this_00._M_p = local_48._M_dataplus._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_48._M_string_length + 8) =
           *(_Atomic_word *)(local_48._M_string_length + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001606a9;
    }
    else {
      *(_Atomic_word *)(local_48._M_string_length + 8) =
           *(_Atomic_word *)(local_48._M_string_length + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
  }
LAB_001606a9:
  if (*(hash_type *)(this_00._M_p + 8) == 0) {
    (*((db->storage_).file_.super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_file_base[5])(&local_48);
    raise<pstore::error_code,std::__cxx11::string>(index_corrupt,&local_48);
  }
  uVar2 = size((internal_node *)this_00._M_p);
  sVar3 = size_bytes((ulong)uVar2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if (sVar3 < 0x11) {
    assert_failed("actual_size > sizeof (internal_node) - sizeof (internal_node::children_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x110);
  }
  (*db->_vptr_database[2])(&local_48,db,addr.a_.a_,sVar3,1,0);
  *(pointer *)(this->signature_)._M_elems = local_48._M_dataplus._M_p;
  this->bitmap_ = local_48._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_48._M_string_length + 8) =
           *(_Atomic_word *)(local_48._M_string_length + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00160734;
    }
    else {
      *(_Atomic_word *)(local_48._M_string_length + 8) =
           *(_Atomic_word *)(local_48._M_string_length + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
  }
LAB_00160734:
  bVar1 = validate_after_load(*(internal_node **)(this->signature_)._M_elems,addr);
  if (bVar1) {
    sVar4.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar4.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = this;
    return (shared_ptr<const_pstore::index::details::internal_node>)
           sVar4.
           super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  (*((db->storage_).file_.super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_file_base[5])(&local_48);
  raise<pstore::error_code,std::__cxx11::string>(index_corrupt,&local_48);
}

Assistant:

auto internal_node::read_node (database const & db,
                                           typed_address<internal_node> const addr)
                -> std::shared_ptr<internal_node const> {
                /// Sadly, loading an internal_node needs to done in three stages:
                /// 1. Load the basic structure
                /// 2. Calculate the actual size of the child pointer array
                /// 3. Load the complete structure along with its child pointer array
                auto base = std::static_pointer_cast<internal_node const> (
                    db.getro (addr.to_address (),
                              sizeof (internal_node) - sizeof (internal_node::children_)));

                if (base->get_bitmap () == 0) {
                    raise (error_code::index_corrupt, db.path ());
                }
                std::size_t const actual_size = internal_node::size_bytes (base->size ());
                base.reset ();

                PSTORE_ASSERT (actual_size >
                               sizeof (internal_node) - sizeof (internal_node::children_));
                auto resl = std::static_pointer_cast<internal_node const> (
                    db.getro (addr.to_address (), actual_size));

                if (!validate_after_load (*resl, addr)) {
                    raise (error_code::index_corrupt, db.path ());
                }

                return resl;
            }